

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

int secp256k1_rangeproof_verify_impl
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,uchar *blindout,uint64_t *value_out,
              uchar *message_out,size_t *outlen,uchar *nonce,uint64_t *min_value,uint64_t *max_value
              ,secp256k1_ge *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_ge *genp)

{
  byte bVar1;
  byte bVar2;
  uint64_t *puVar3;
  uchar *nonce_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_scalar *psVar9;
  long lVar10;
  uint64_t value;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t local_6360;
  uint local_6354;
  ulong local_6350;
  int overflow;
  secp256k1_ecmult_gen_context *local_6338;
  uint64_t *local_6330;
  uchar *local_6328;
  size_t *local_6320;
  uchar *local_6318;
  uchar *local_6310;
  long local_6308;
  uint64_t local_6300;
  uchar m [33];
  secp256k1_gej accj;
  uchar signs [31];
  secp256k1_scalar blind;
  secp256k1_ge c;
  secp256k1_sha256 local_61a8;
  size_t rsizes [32];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  secp256k1_scalar evalues [128];
  
  if (plen < 0x41) {
    return 0;
  }
  bVar1 = *proof;
  if ((char)bVar1 < '\0') {
    return 0;
  }
  if (bVar1 < 0x40) {
    *max_value = 0;
    local_6354 = 0xffffffff;
    local_6350 = 0;
    local_6360 = 1;
    lVar10 = 1;
  }
  else {
    local_6354 = bVar1 & 0x1f;
    if (0x12 < (byte)local_6354) {
      return 0;
    }
    bVar2 = proof[1];
    if (0x3f < bVar2) {
      return 0;
    }
    local_6350 = (ulong)(bVar2 + 1);
    uVar8 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
    *max_value = uVar8;
    lVar10 = 1;
    uVar5 = local_6354;
    if ((byte)local_6354 == 0) {
      local_6354 = 0;
    }
    else {
      do {
        if (0x1999999999999999 < uVar8) {
          return 0;
        }
        uVar8 = uVar8 * 10;
        *max_value = uVar8;
        lVar10 = lVar10 * 10;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    local_6360 = 2;
  }
  *min_value = 0;
  if ((bVar1 & 0x20) == 0) {
    uVar8 = 0;
  }
  else {
    if (plen - local_6360 < 8) {
      return 0;
    }
    uVar8 = 0;
    lVar13 = 0;
    do {
      uVar8 = (ulong)proof[lVar13 + local_6360] | uVar8 << 8;
      *min_value = uVar8;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 8);
    local_6360 = local_6360 + 8;
  }
  if (CARRY8(uVar8,*max_value)) {
    return 0;
  }
  *max_value = uVar8 + *max_value;
  rsizes[0] = 1;
  iVar4 = (int)local_6350;
  if (iVar4 == 0) {
    uVar8 = 1;
    uVar5 = 1;
  }
  else {
    uVar8 = local_6350 >> 1;
    if (iVar4 == 1) {
      uVar5 = 0;
    }
    else {
      lVar13 = uVar8 + (uVar8 == 0);
      lVar7 = lVar13 + -1;
      auVar15._8_4_ = (int)lVar7;
      auVar15._0_8_ = lVar7;
      auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar11 = 0;
      auVar15 = auVar15 ^ _DAT_00142f30;
      auVar16 = _DAT_00142f20;
      do {
        auVar17 = auVar16 ^ _DAT_00142f30;
        if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                    auVar15._4_4_ < auVar17._4_4_) & 1)) {
          *(undefined8 *)((long)rsizes + uVar11) = 4;
        }
        if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
            auVar17._12_4_ <= auVar15._12_4_) {
          *(undefined8 *)((long)rsizes + uVar11 + 8) = 4;
        }
        lVar7 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar7 + 2;
        uVar11 = uVar11 + 0x10;
      } while (((int)lVar13 * 8 + 8U & 0xff0) != uVar11);
      uVar5 = iVar4 * 2 & 0xfffffffc;
      if ((local_6350 & 1) == 0) goto LAB_00126794;
    }
    rsizes[uVar8] = 2;
    uVar5 = uVar5 | 2;
    uVar8 = uVar8 + 1;
  }
LAB_00126794:
  uVar11 = (ulong)((int)uVar8 + 6U >> 3);
  if (plen - local_6360 < (uVar5 + (int)uVar8) * 0x20 + uVar11) {
    return 0;
  }
  local_61a8.s[0] = 0x6a09e667;
  local_61a8.s[1] = 0xbb67ae85;
  local_61a8.s[2] = 0x3c6ef372;
  local_61a8.s[3] = 0xa54ff53a;
  local_61a8.s[4] = 0x510e527f;
  local_61a8.s[5] = 0x9b05688c;
  local_61a8.s[6] = 0x1f83d9ab;
  local_61a8.s[7] = 0x5be0cd19;
  local_61a8.bytes = 0;
  s[1].d[0] = (commit->x).n[4];
  s[0].d[0] = (commit->x).n[0];
  s[0].d[1] = (commit->x).n[1];
  s[0].d[2] = (commit->x).n[2];
  s[0].d[3] = (commit->x).n[3];
  local_6338 = ecmult_gen_ctx;
  local_6328 = blindout;
  local_6320 = outlen;
  local_6318 = nonce;
  local_6310 = message_out;
  secp256k1_fe_normalize((secp256k1_fe *)s);
  iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&commit->y);
  m[0] = (byte)iVar4 ^ 1;
  secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
  secp256k1_sha256_write(&local_61a8,m,0x21);
  s[1].d[0] = (genp->x).n[4];
  s[0].d[0] = (genp->x).n[0];
  s[0].d[1] = (genp->x).n[1];
  s[0].d[2] = (genp->x).n[2];
  s[0].d[3] = (genp->x).n[3];
  secp256k1_fe_normalize((secp256k1_fe *)s);
  iVar4 = secp256k1_fe_sqrt(&pubs[0].x,&genp->y);
  m[0] = (byte)iVar4 ^ 1;
  secp256k1_fe_get_b32(m + 1,(secp256k1_fe *)s);
  secp256k1_sha256_write(&local_61a8,m,0x21);
  secp256k1_sha256_write(&local_61a8,proof,local_6360);
  uVar14 = uVar8 - 1;
  if (uVar14 != 0) {
    uVar6 = 0;
    do {
      signs[uVar6] = (proof[(uVar6 >> 3) + local_6360] >> ((uint)uVar6 & 7) & 1) != 0;
      uVar6 = uVar6 + 1;
    } while (uVar14 != uVar6);
    if (((uVar14 & 7) != 0) && (proof[uVar11 + local_6360 + -1] >> (sbyte)(uVar14 & 7) != 0)) {
      return 0;
    }
  }
  lVar13 = uVar11 + local_6360;
  accj.infinity = 1;
  accj.x.n[0] = 0;
  accj.x.n[1] = 0;
  accj.x.n[2] = 0;
  accj.x.n[3] = 0;
  accj.x.n[4] = 0;
  accj.y.n[0] = 0;
  accj.y.n[1] = 0;
  accj.y.n[2] = 0;
  accj.y.n[3] = 0;
  accj.y.n[4] = 0;
  accj.z.n[0] = 0;
  accj.z.n[1] = 0;
  accj.z.n[2] = 0;
  accj.z.n[3] = 0;
  accj.z.n[4] = 0;
  if (*min_value != 0) {
    secp256k1_pedersen_ecmult_small(&accj,*min_value,genp);
  }
  local_6330 = value_out;
  if (uVar14 == 0) {
    lVar7 = 0;
  }
  else {
    uVar11 = 0;
    lVar7 = 0;
    local_6308 = lVar10;
    do {
      iVar4 = secp256k1_fe_set_b32((secp256k1_fe *)s,proof + lVar13);
      if (iVar4 == 0) {
        return 0;
      }
      iVar4 = secp256k1_ge_set_xquad(&c,(secp256k1_fe *)s);
      if (iVar4 == 0) {
        return 0;
      }
      if (signs[uVar11] != '\0') {
        secp256k1_ge_neg(&c,&c);
      }
      secp256k1_sha256_write(&local_61a8,signs + uVar11,1);
      secp256k1_sha256_write(&local_61a8,proof + lVar13,0x20);
      pubs[lVar7].infinity = c.infinity;
      pubs[lVar7].x.n[0] = c.x.n[0];
      pubs[lVar7].x.n[1] = c.x.n[1];
      pubs[lVar7].x.n[2] = c.x.n[2];
      pubs[lVar7].x.n[3] = c.x.n[3];
      pubs[lVar7].x.n[4] = c.x.n[4];
      pubs[lVar7].y.n[0] = c.y.n[0];
      pubs[lVar7].y.n[1] = c.y.n[1];
      pubs[lVar7].y.n[2] = c.y.n[2];
      pubs[lVar7].y.n[3] = c.y.n[3];
      pubs[lVar7].y.n[4] = c.y.n[4];
      pubs[lVar7].z.n[0] = 1;
      pubs[lVar7].z.n[3] = 0;
      pubs[lVar7].z.n[4] = 0;
      pubs[lVar7].z.n[1] = 0;
      pubs[lVar7].z.n[2] = 0;
      secp256k1_gej_add_ge_var(&accj,&accj,&c,(secp256k1_fe *)0x0);
      lVar13 = lVar13 + 0x20;
      lVar7 = lVar7 + rsizes[uVar11];
      uVar11 = uVar11 + 1;
      lVar10 = local_6308;
    } while (uVar14 != uVar11);
  }
  secp256k1_gej_neg(&accj,&accj);
  secp256k1_gej_add_ge_var(pubs + lVar7,&accj,commit,(secp256k1_fe *)0x0);
  if (pubs[lVar7].infinity == 0) {
    secp256k1_rangeproof_pub_expand(pubs,local_6354,rsizes,uVar8,genp);
    sVar12 = lVar13 + 0x20;
    lVar7 = lVar7 + rsizes[uVar8 - 1];
    if (lVar7 != 0) {
      psVar9 = s;
      do {
        secp256k1_scalar_set_b32(psVar9,proof + sVar12,&overflow);
        if (overflow != 0) {
          return 0;
        }
        sVar12 = sVar12 + 0x20;
        psVar9 = psVar9 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    if (sVar12 != plen) {
      return 0;
    }
    if (extra_commit != (uchar *)0x0) {
      secp256k1_sha256_write(&local_61a8,extra_commit,extra_commit_len);
    }
    secp256k1_sha256_finalize(&local_61a8,m);
    nonce_00 = local_6318;
    psVar9 = evalues;
    if (local_6318 == (uchar *)0x0) {
      psVar9 = (secp256k1_scalar *)0x0;
    }
    iVar4 = secp256k1_borromean_verify(psVar9,proof + lVar13,s,pubs,rsizes,uVar8,m,0x20);
    puVar3 = local_6330;
    if (nonce_00 == (uchar *)0x0) {
      return iVar4;
    }
    if (iVar4 == 0) {
      return 0;
    }
    if ((local_6338 != (secp256k1_ecmult_gen_context *)0x0) &&
       (iVar4 = secp256k1_rangeproof_rewind_inner
                          (&blind,&local_6300,local_6310,local_6320,evalues,s,rsizes,uVar8,nonce_00,
                           commit,proof,local_6360,genp), iVar4 != 0)) {
      value = lVar10 * local_6300 + *min_value;
      secp256k1_pedersen_ecmult(local_6338,&accj,&blind,value,genp);
      if (accj.infinity == 0) {
        secp256k1_gej_neg(&accj,&accj);
        secp256k1_gej_add_ge_var(&accj,&accj,commit,(secp256k1_fe *)0x0);
        if (accj.infinity != 0) {
          if (local_6328 != (uchar *)0x0) {
            secp256k1_scalar_get_b32(local_6328,&blind);
          }
          if (puVar3 != (uint64_t *)0x0) {
            *puVar3 = value;
          }
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_rangeproof_verify_impl(const secp256k1_ecmult_gen_context* ecmult_gen_ctx,
 unsigned char *blindout, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value, const secp256k1_ge *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_ge* genp) {
    secp256k1_gej accj;
    secp256k1_gej pubs[128];
    secp256k1_ge c;
    secp256k1_scalar s[128];
    secp256k1_scalar evalues[128]; /* Challenges, only used during proof rewind. */
    secp256k1_sha256 sha256_m;
    size_t rsizes[32];
    int ret;
    size_t i;
    int exp;
    int mantissa;
    size_t offset;
    size_t rings;
    int overflow;
    size_t npub;
    int offset_post_header;
    uint64_t scale;
    unsigned char signs[31];
    unsigned char m[33];
    const unsigned char *e0;
    offset = 0;
    if (!secp256k1_rangeproof_getheader_impl(&offset, &exp, &mantissa, &scale, min_value, max_value, proof, plen)) {
        return 0;
    }
    offset_post_header = offset;
    rings = 1;
    rsizes[0] = 1;
    npub = 1;
    if (mantissa != 0) {
        rings = (mantissa >> 1);
        for (i = 0; i < rings; i++) {
            rsizes[i] = 4;
        }
        npub = (mantissa >> 1) << 2;
        if (mantissa & 1) {
            rsizes[rings] = 2;
            npub += rsizes[rings];
            rings++;
        }
    }
    VERIFY_CHECK(rings <= 32);
    if (plen - offset < 32 * (npub + rings - 1) + 32 + ((rings+6) >> 3)) {
        return 0;
    }
    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_rangeproof_serialize_point(m, commit);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_rangeproof_serialize_point(m, genp);
    secp256k1_sha256_write(&sha256_m, m, 33);
    secp256k1_sha256_write(&sha256_m, proof, offset);
    for(i = 0; i < rings - 1; i++) {
        signs[i] = (proof[offset + ( i>> 3)] & (1 << (i & 7))) != 0;
    }
    offset += (rings + 6) >> 3;
    if ((rings - 1) & 7) {
        /* Number of coded blinded points is not a multiple of 8, force extra sign bits to 0 to reject mutation. */
        if ((proof[offset - 1] >> ((rings - 1) & 7)) != 0) {
            return 0;
        }
    }
    npub = 0;
    secp256k1_gej_set_infinity(&accj);
    if (*min_value) {
        secp256k1_pedersen_ecmult_small(&accj, *min_value, genp);
    }
    for(i = 0; i < rings - 1; i++) {
        secp256k1_fe fe;
        if (!secp256k1_fe_set_b32(&fe, &proof[offset]) ||
            !secp256k1_ge_set_xquad(&c, &fe)) {
            return 0;
        }
        if (signs[i]) {
            secp256k1_ge_neg(&c, &c);
        }
        /* Not using secp256k1_rangeproof_serialize_point as we almost have it
         * serialized form already. */
        secp256k1_sha256_write(&sha256_m, &signs[i], 1);
        secp256k1_sha256_write(&sha256_m, &proof[offset], 32);
        secp256k1_gej_set_ge(&pubs[npub], &c);
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        offset += 32;
        npub += rsizes[i];
    }
    secp256k1_gej_neg(&accj, &accj);
    secp256k1_gej_add_ge_var(&pubs[npub], &accj, commit, NULL);
    if (secp256k1_gej_is_infinity(&pubs[npub])) {
        return 0;
    }
    secp256k1_rangeproof_pub_expand(pubs, exp, rsizes, rings, genp);
    npub += rsizes[rings - 1];
    e0 = &proof[offset];
    offset += 32;
    for (i = 0; i < npub; i++) {
        secp256k1_scalar_set_b32(&s[i], &proof[offset], &overflow);
        if (overflow) {
            return 0;
        }
        offset += 32;
    }
    if (offset != plen) {
        /*Extra data found, reject.*/
        return 0;
    }
    if (extra_commit != NULL) {
        secp256k1_sha256_write(&sha256_m, extra_commit, extra_commit_len);
    }
    secp256k1_sha256_finalize(&sha256_m, m);
    ret = secp256k1_borromean_verify(nonce ? evalues : NULL, e0, s, pubs, rsizes, rings, m, 32);
    if (ret && nonce) {
        /* Given the nonce, try rewinding the witness to recover its initial state. */
        secp256k1_scalar blind;
        uint64_t vv;
        if (!ecmult_gen_ctx) {
            return 0;
        }
        if (!secp256k1_rangeproof_rewind_inner(&blind, &vv, message_out, outlen, evalues, s, rsizes, rings, nonce, commit, proof, offset_post_header, genp)) {
            return 0;
        }
        /* Unwind apparently successful, see if the commitment can be reconstructed. */
        /* FIXME: should check vv is in the mantissa's range. */
        vv = (vv * scale) + *min_value;
        secp256k1_pedersen_ecmult(ecmult_gen_ctx, &accj, &blind, vv, genp);
        if (secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        secp256k1_gej_neg(&accj, &accj);
        secp256k1_gej_add_ge_var(&accj, &accj, commit, NULL);
        if (!secp256k1_gej_is_infinity(&accj)) {
            return 0;
        }
        if (blindout) {
            secp256k1_scalar_get_b32(blindout, &blind);
        }
        if (value_out) {
            *value_out = vv;
        }
    }
    return ret;
}